

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall
embree::SceneGraph::MultiTransformNode::print(MultiTransformNode *this,ostream *cout,int depth)

{
  ostream *poVar1;
  void *pvVar2;
  size_type sVar3;
  reference pvVar4;
  int in_EDX;
  ostream *in_RSI;
  void *in_RDI;
  ostream *in_stack_ffffffffffffffb8;
  int iVar5;
  ostream *in_stack_ffffffffffffffc0;
  
  poVar1 = std::operator<<(in_RSI,"MultiTransformNode @ ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI);
  poVar1 = std::operator<<(poVar1," { ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  iVar5 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  tab(in_stack_ffffffffffffffc0,iVar5);
  poVar1 = std::operator<<(in_RSI,"closed = ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(*(byte *)((long)in_RDI + 0x58) & 1));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  tab(in_stack_ffffffffffffffc0,iVar5);
  poVar1 = std::operator<<(in_RSI,"numInstances = ");
  sVar3 = std::
          vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
          ::size((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                  *)((long)in_RDI + 0x68));
  pvVar2 = (void *)std::ostream::operator<<(poVar1,sVar3);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  sVar3 = std::
          vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
          ::size((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                  *)((long)in_RDI + 0x68));
  if (sVar3 != 0) {
    tab(poVar1,iVar5);
    in_stack_ffffffffffffffb8 = std::operator<<(in_RSI,"numTimeSteps = ");
    pvVar4 = std::
             vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
             ::operator[]((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                           *)((long)in_RDI + 0x68),0);
    pvVar2 = (void *)std::ostream::operator<<
                               (in_stack_ffffffffffffffb8,(pvVar4->spaces).size_active);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  iVar5 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  tab(poVar1,iVar5);
  std::operator<<(in_RSI,"child = ");
  (**(code **)(**(long **)((long)in_RDI + 0x80) + 0x20))
            (*(long **)((long)in_RDI + 0x80),in_RSI,in_EDX + 1);
  tab(poVar1,iVar5);
  poVar1 = std::operator<<(in_RSI,"}");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void SceneGraph::MultiTransformNode::print(std::ostream& cout, int depth)
  {
    cout << "MultiTransformNode @ " << this << " { " << std::endl;
    tab(cout, depth+1); cout << "closed = " << closed << std::endl;
    tab(cout, depth+1); cout << "numInstances = " << spaces.size() << std::endl;
    if (spaces.size() > 0) {
      tab(cout, depth+1); cout << "numTimeSteps = " << spaces[0].size() << std::endl;
    }
    tab(cout, depth+1); cout << "child = "; child->print(cout,depth+1);
    tab(cout, depth); cout << "}" << std::endl;
  }